

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-paint.c
# Opt level: O2

plutovg_paint_t *
plutovg_paint_create_texture
          (plutovg_surface_t *surface,plutovg_texture_type_t type,float opacity,
          plutovg_matrix_t *matrix)

{
  float fVar1;
  float fVar2;
  plutovg_paint_t *ppVar3;
  plutovg_paint_t pVar4;
  float fVar5;
  
  ppVar3 = (plutovg_paint_t *)plutovg_paint_create(PLUTOVG_PAINT_TYPE_TEXTURE,0x30);
  ppVar3[1].ref_count = type;
  fVar5 = 1.0;
  if (opacity <= 1.0) {
    fVar5 = opacity;
  }
  ppVar3[1].type = ~-(uint)(opacity < 0.0) & (uint)fVar5;
  if (matrix == (plutovg_matrix_t *)0x0) {
    ppVar3[2].ref_count = 0x3f800000;
    ppVar3[2].type = PLUTOVG_PAINT_TYPE_COLOR;
    ppVar3[3].ref_count = 0;
    ppVar3[3].type = 0x3f800000;
    ppVar3[4].ref_count = 0;
    ppVar3[4].type = PLUTOVG_PAINT_TYPE_COLOR;
  }
  else {
    fVar5 = matrix->f;
    ppVar3[4].ref_count = (int)matrix->e;
    ppVar3[4].type = (plutovg_paint_type_t)fVar5;
    fVar5 = matrix->b;
    fVar1 = matrix->c;
    fVar2 = matrix->d;
    ppVar3[2].ref_count = (int)matrix->a;
    ppVar3[2].type = (plutovg_paint_type_t)fVar5;
    ppVar3[3].ref_count = (int)fVar1;
    ppVar3[3].type = (plutovg_paint_type_t)fVar2;
  }
  pVar4 = (plutovg_paint_t)plutovg_surface_reference(surface);
  ppVar3[5] = pVar4;
  return ppVar3;
}

Assistant:

plutovg_paint_t* plutovg_paint_create_texture(plutovg_surface_t* surface, plutovg_texture_type_t type, float opacity, const plutovg_matrix_t* matrix)
{
    plutovg_texture_paint_t* texture = plutovg_paint_create(PLUTOVG_PAINT_TYPE_TEXTURE, sizeof(plutovg_texture_paint_t));
    texture->type = type;
    texture->opacity = plutovg_clamp(opacity, 0.f, 1.f);
    texture->matrix = matrix ? *matrix : PLUTOVG_IDENTITY_MATRIX;
    texture->surface = plutovg_surface_reference(surface);
    return &texture->base;
}